

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMeshGeometry.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::MeshGeometry::ReadVertexDataBinormals
          (MeshGeometry *this,
          vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *binormals_out,
          Scope *source,string *MappingInformationType,string *ReferenceInformationType)

{
  char *dataElementName;
  char *ReferenceInformationType_00;
  string *MappingInformationType_00;
  string *source_00;
  Scope *data_out;
  ElementMap *pEVar1;
  size_type sVar2;
  size_type vertex_count;
  char *local_f8;
  allocator local_a1;
  key_type local_a0;
  char *local_80;
  char *strIdx;
  allocator local_61;
  key_type local_60;
  char *local_40;
  char *str;
  string *ReferenceInformationType_local;
  string *MappingInformationType_local;
  Scope *source_local;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *binormals_out_local;
  MeshGeometry *this_local;
  
  str = (char *)ReferenceInformationType;
  ReferenceInformationType_local = MappingInformationType;
  MappingInformationType_local = (string *)source;
  source_local = (Scope *)binormals_out;
  binormals_out_local = (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)this;
  pEVar1 = Scope::Elements_abi_cxx11_(source);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"Binormals",&local_61);
  sVar2 = std::
          multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
          ::count(pEVar1,&local_60);
  local_40 = "Binormal";
  if (sVar2 != 0) {
    local_40 = "Binormals";
  }
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  pEVar1 = Scope::Elements_abi_cxx11_((Scope *)MappingInformationType_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a0,"Binormals",&local_a1);
  sVar2 = std::
          multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
          ::count(pEVar1,&local_a0);
  if (sVar2 == 0) {
    local_f8 = (char *)std::__cxx11::string::c_str();
  }
  else {
    local_f8 = (char *)std::__cxx11::string::c_str();
  }
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  data_out = source_local;
  source_00 = MappingInformationType_local;
  MappingInformationType_00 = ReferenceInformationType_local;
  ReferenceInformationType_00 = str;
  dataElementName = local_40;
  local_80 = local_f8;
  vertex_count = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                           (&this->m_vertices);
  ResolveVertexDataArray<aiVector3t<float>>
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)data_out,
             (Scope *)source_00,MappingInformationType_00,(string *)ReferenceInformationType_00,
             dataElementName,local_f8,vertex_count,&this->m_mapping_counts,&this->m_mapping_offsets,
             &this->m_mappings);
  return;
}

Assistant:

void MeshGeometry::ReadVertexDataBinormals(std::vector<aiVector3D>& binormals_out, const Scope& source,
    const std::string& MappingInformationType,
    const std::string& ReferenceInformationType)
{
    const char * str = source.Elements().count( "Binormals" ) > 0 ? "Binormals" : "Binormal";
    const char * strIdx = source.Elements().count( "Binormals" ) > 0 ? BinormalsIndexToken.c_str() : BinormalIndexToken.c_str();
    ResolveVertexDataArray(binormals_out,source,MappingInformationType,ReferenceInformationType,
        str,
        strIdx,
        m_vertices.size(),
        m_mapping_counts,
        m_mapping_offsets,
        m_mappings);
}